

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O0

vector<despot::State_*,_std::allocator<despot::State_*>_> *
despot::ParticleBelief::Sample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,int num
          ,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,DSPOMDP *model)

{
  double dVar1;
  int iVar2;
  reference ppSVar3;
  size_type sVar4;
  size_type sVar5;
  iterator __first;
  iterator __last;
  log_ostream *plVar6;
  ostream *poVar7;
  int local_7c;
  int i_1;
  value_type local_58;
  State *particle;
  int i;
  double cur;
  double dStack_38;
  int pos;
  double mass;
  double unit;
  DSPOMDP *model_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *pvStack_10;
  int num_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *sample;
  
  mass = 1.0 / (double)num;
  unit = (double)model;
  model_local = (DSPOMDP *)particles;
  particles_local._4_4_ = num;
  pvStack_10 = __return_storage_ptr__;
  dStack_38 = Random::NextDouble((Random *)&Random::RANDOM,0.0,mass);
  cur._4_4_ = 0;
  ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[](particles,0);
  _i = (*ppSVar3)->weight;
  particle._7_1_ = 0;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(__return_storage_ptr__);
  for (particle._0_4_ = 0; (int)particle < particles_local._4_4_; particle._0_4_ = (int)particle + 1
      ) {
    for (; dVar1 = unit, _i < dStack_38; _i = (*ppSVar3)->weight + _i) {
      cur._4_4_ = cur._4_4_ + 1;
      sVar4 = (size_type)cur._4_4_;
      sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(particles);
      if (sVar4 == sVar5) {
        cur._4_4_ = 0;
      }
      ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                          (particles,(long)cur._4_4_);
    }
    dStack_38 = dStack_38 + mass;
    ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (particles,(long)cur._4_4_);
    local_58 = (value_type)(**(code **)(*(long *)dVar1 + 0xb0))(dVar1,*ppSVar3);
    local_58->weight = mass;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
              (__return_storage_ptr__,&local_58);
  }
  __first = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::begin
                      (__return_storage_ptr__);
  __last = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::end
                     (__return_storage_ptr__);
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<despot::State**,std::vector<despot::State*,std::allocator<despot::State*>>>>
            ((__normal_iterator<despot::State_**,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>
              )__first._M_current,
             (__normal_iterator<despot::State_**,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>
              )__last._M_current);
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 3 < iVar2)) {
    plVar6 = logging::stream(4);
    poVar7 = std::operator<<(&plVar6->super_ostream,"[ParticleBelief::Sample] Sampled ");
    sVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                      (__return_storage_ptr__);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar4);
    poVar7 = std::operator<<(poVar7," particles");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  for (local_7c = 0;
      sVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        (__return_storage_ptr__), (ulong)(long)local_7c < sVar4;
      local_7c = local_7c + 1) {
    iVar2 = logging::level();
    if ((0 < iVar2) && (iVar2 = logging::level(), 4 < iVar2)) {
      plVar6 = logging::stream(5);
      poVar7 = std::operator<<(&plVar6->super_ostream," ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_7c);
      poVar7 = std::operator<<(poVar7," = ");
      ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                          (__return_storage_ptr__,(long)local_7c);
      poVar7 = despot::operator<<(poVar7,*ppSVar3);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> ParticleBelief::Sample(int num, vector<State*> particles,
	const DSPOMDP* model) {

	double unit = 1.0 / num;
	double mass = Random::RANDOM.NextDouble(0, unit);
	int pos = 0;
	double cur = particles[0]->weight;
	vector<State*> sample;
	for (int i = 0; i < num; i++) {
		while (mass > cur) {
			pos++;
			if (pos == particles.size())
				pos = 0;

			cur += particles[pos]->weight;
		}

		mass += unit;

		State* particle = model->Copy(particles[pos]);
		particle->weight = unit;
		sample.push_back(particle);
	}

	random_shuffle(sample.begin(), sample.end());

	logd << "[ParticleBelief::Sample] Sampled " << sample.size() << " particles"
		<< endl;
	for (int i = 0; i < sample.size(); i++) {
		logv << " " << i << " = " << *sample[i] << endl;
	}

	return sample;
}